

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

void pythonStartElement(void *user_data,xmlChar *name,xmlChar **attrs)

{
  xmlChar *pxVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  char *pcVar7;
  xmlChar **ppxVar8;
  long *plVar9;
  
  iVar2 = PyObject_HasAttrString(user_data,"startElement");
  if ((iVar2 != 0) || (iVar3 = PyObject_HasAttrString(user_data,"start"), iVar3 != 0)) {
    if (attrs == (xmlChar **)0x0 && iVar2 != 0) {
      plVar9 = (long *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
    }
    else {
      plVar9 = (long *)PyDict_New();
      if ((attrs != (xmlChar **)0x0) && (*attrs != (xmlChar *)0x0)) {
        ppxVar8 = attrs + 2;
        do {
          plVar5 = (long *)PyUnicode_FromString();
          if (ppxVar8[-1] == (xmlChar *)0x0) {
            __Py_NoneStruct = __Py_NoneStruct + 1;
            plVar4 = (long *)&_Py_NoneStruct;
          }
          else {
            plVar4 = (long *)PyUnicode_FromString();
          }
          PyDict_SetItem(plVar9,plVar5,plVar4);
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            _Py_Dealloc(plVar5);
          }
          *plVar4 = *plVar4 + -1;
          if (*plVar4 == 0) {
            _Py_Dealloc(plVar4);
          }
          pxVar1 = *ppxVar8;
          ppxVar8 = ppxVar8 + 2;
        } while (pxVar1 != (xmlChar *)0x0);
      }
    }
    pcVar7 = "start";
    if (iVar2 != 0) {
      pcVar7 = "startElement";
    }
    plVar5 = (long *)_PyObject_CallMethod_SizeT(user_data,pcVar7,"sO",name,plVar9);
    lVar6 = PyErr_Occurred();
    if (lVar6 != 0) {
      PyErr_Print();
    }
    if ((plVar9 != (long *)0x0) && (*plVar9 = *plVar9 + -1, *plVar9 == 0)) {
      _Py_Dealloc(plVar9);
    }
    if ((plVar5 != (long *)0x0) && (*plVar5 = *plVar5 + -1, *plVar5 == 0)) {
      _Py_Dealloc(plVar5);
      return;
    }
  }
  return;
}

Assistant:

static void
pythonStartElement(void *user_data, const xmlChar * name,
                   const xmlChar ** attrs)
{
    int i;
    PyObject *handler;
    PyObject *dict;
    PyObject *attrname;
    PyObject *attrvalue;
    PyObject *result = NULL;
    int type = 0;

#ifdef DEBUG_SAX
    printf("pythonStartElement(%s) called\n", name);
#endif
    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "startElement"))
        type = 1;
    else if (PyObject_HasAttrString(handler, (char *) "start"))
        type = 2;
    if (type != 0) {
        /*
         * the xmllib interface always generates a dictionary,
         * possibly empty
         */
        if ((attrs == NULL) && (type == 1)) {
            Py_XINCREF(Py_None);
            dict = Py_None;
        } else if (attrs == NULL) {
            dict = PyDict_New();
        } else {
            dict = PyDict_New();
            for (i = 0; attrs[i] != NULL; i++) {
                attrname = PY_IMPORT_STRING((char *) attrs[i]);
                i++;
                if (attrs[i] != NULL) {
                    attrvalue = PY_IMPORT_STRING((char *) attrs[i]);
                } else {
                    Py_XINCREF(Py_None);
                    attrvalue = Py_None;
                }
                PyDict_SetItem(dict, attrname, attrvalue);
		Py_DECREF(attrname);
		Py_DECREF(attrvalue);
            }
        }

        if (type == 1)
            result = PyObject_CallMethod(handler, (char *) "startElement",
                                         (char *) "sO", name, dict);
        else if (type == 2)
            result = PyObject_CallMethod(handler, (char *) "start",
                                         (char *) "sO", name, dict);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(dict);
        Py_XDECREF(result);
    }
}